

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O2

XMLContentModel * __thiscall xercesc_4_0::DTDElementDecl::createChildModel(DTDElementDecl *this)

{
  int iVar1;
  undefined4 extraout_var;
  SimpleContentModel *pSVar3;
  DFAContentModel *this_00;
  undefined4 extraout_var_00;
  RuntimeException *this_01;
  long lVar2;
  
  iVar1 = (*(this->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[9])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 == 0) {
    this_01 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDElementDecl.cpp"
               ,0x118,CM_UnknownCMSpecType,(this->super_XMLElementDecl).fMemoryManager);
  }
  else {
    if ((*(long *)(lVar2 + 0x10) == 0) || (*(int *)(*(long *)(lVar2 + 0x10) + 0x20) != -1)) {
      iVar1 = *(int *)(lVar2 + 0x30);
      if (iVar1 - 1U < 3) {
        if (*(int *)(*(long *)(lVar2 + 0x20) + 0x30) == 0) {
          pSVar3 = (SimpleContentModel *)
                   XMemory::operator_new(0x28,(this->super_XMLElementDecl).fMemoryManager);
          SimpleContentModel::SimpleContentModel
                    (pSVar3,true,*(QName **)(*(long *)(lVar2 + 0x20) + 0x10),(QName *)0x0,
                     *(NodeTypes *)(lVar2 + 0x30),(this->super_XMLElementDecl).fMemoryManager);
          return &pSVar3->super_XMLContentModel;
        }
      }
      else {
        if (1 < iVar1 - 4U) {
          if (iVar1 == 0) {
            pSVar3 = (SimpleContentModel *)
                     XMemory::operator_new(0x28,(this->super_XMLElementDecl).fMemoryManager);
            SimpleContentModel::SimpleContentModel
                      (pSVar3,true,*(QName **)(lVar2 + 0x10),(QName *)0x0,Leaf,
                       (this->super_XMLElementDecl).fMemoryManager);
            return &pSVar3->super_XMLContentModel;
          }
          this_01 = (RuntimeException *)__cxa_allocate_exception(0x30);
          RuntimeException::RuntimeException
                    (this_01,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDElementDecl.cpp"
                     ,0x15e,CM_UnknownCMSpecType,(this->super_XMLElementDecl).fMemoryManager);
          goto LAB_002f5d55;
        }
        if ((*(int *)(*(long *)(lVar2 + 0x20) + 0x30) == 0) &&
           (*(int *)(*(long *)(lVar2 + 0x28) + 0x30) == 0)) {
          pSVar3 = (SimpleContentModel *)
                   XMemory::operator_new(0x28,(this->super_XMLElementDecl).fMemoryManager);
          SimpleContentModel::SimpleContentModel
                    (pSVar3,true,*(QName **)(*(long *)(lVar2 + 0x20) + 0x10),
                     *(QName **)(*(long *)(lVar2 + 0x28) + 0x10),*(NodeTypes *)(lVar2 + 0x30),
                     (this->super_XMLElementDecl).fMemoryManager);
          return &pSVar3->super_XMLContentModel;
        }
      }
      this_00 = (DFAContentModel *)
                XMemory::operator_new(0x88,(this->super_XMLElementDecl).fMemoryManager);
      iVar1 = (*(this->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[9])(this);
      DFAContentModel::DFAContentModel
                (this_00,true,(ContentSpecNode *)CONCAT44(extraout_var_00,iVar1),
                 (this->super_XMLElementDecl).fMemoryManager);
      return &this_00->super_XMLContentModel;
    }
    this_01 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDElementDecl.cpp"
               ,0x120,CM_NoPCDATAHere,(this->super_XMLElementDecl).fMemoryManager);
  }
LAB_002f5d55:
  __cxa_throw(this_01,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

XMLContentModel* DTDElementDecl::createChildModel()
{
    // Get the content spec node of the element
    ContentSpecNode* specNode = getContentSpec();

    if(!specNode)
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, getMemoryManager());

    //
    //  Do a sanity check that the node does not have a PCDATA id. Since,
    //  if it was, it should have already gotten taken by the Mixed model.
    //
    if (specNode->getElement()) {
        if (specNode->getElement()->getURI() == XMLElementDecl::fgPCDataElemId)
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_NoPCDATAHere, getMemoryManager());
    }

    //
    //  According to the type of node, we will create the correct type of
    //  content model.
    //
    if (specNode->getType() == ContentSpecNode::Leaf)
    {
        // Create a simple content model
        return new (getMemoryManager()) SimpleContentModel
        (
            true
            , specNode->getElement()
            , 0
            , ContentSpecNode::Leaf
            , getMemoryManager()
        );
    }
     else if ((specNode->getType() == ContentSpecNode::Choice)
          ||  (specNode->getType() == ContentSpecNode::Sequence))
    {
        //
        //  Lets see if both of the children are leafs. If so, then it has to
        //  be a simple content model
        //
        if ((specNode->getFirst()->getType() == ContentSpecNode::Leaf)
        &&  (specNode->getSecond()->getType() == ContentSpecNode::Leaf))
        {
            return new (getMemoryManager()) SimpleContentModel
            (
                true
                , specNode->getFirst()->getElement()
                , specNode->getSecond()->getElement()
                , specNode->getType()
                , getMemoryManager()
            );
        }
    }
     else if ((specNode->getType() == ContentSpecNode::OneOrMore)
          ||  (specNode->getType() == ContentSpecNode::ZeroOrMore)
          ||  (specNode->getType() == ContentSpecNode::ZeroOrOne))
    {
        //
        //  Its a repetition, so see if its one child is a leaf. If so its a
        //  repetition of a single element, so we can do a simple content
        //  model for that.
        //
        if (specNode->getFirst()->getType() == ContentSpecNode::Leaf)
        {
            return new (getMemoryManager()) SimpleContentModel
            (
                true
                , specNode->getFirst()->getElement()
                , 0
                , specNode->getType()
                , getMemoryManager()
            );
        }
    }
     else
    {
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, getMemoryManager());
    }

    // Its not any simple type of content, so create a DFA based content model
    return new (getMemoryManager()) DFAContentModel
    (
        true
        , this->getContentSpec()
        , getMemoryManager()
    );
}